

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void do_abs(void *ptr,int nelem,int type)

{
  undefined8 uVar1;
  double *pdVar2;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar3;
  Integer in_stack_000000a8;
  char *in_stack_000000b0;
  float sx2;
  double x2;
  int i;
  long local_f8;
  uint local_ec;
  ulong local_e8;
  float local_d4;
  float local_c8;
  float local_c4;
  float local_bc;
  double local_b0;
  double local_a0;
  double local_98;
  double local_88;
  int local_7c;
  float local_68;
  float fStack_64;
  int local_14;
  
  switch(in_EDX) {
  case 0x3e9:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (*(int *)(in_RDI + (long)local_14 * 4) < 0) {
        local_7c = -*(int *)(in_RDI + (long)local_14 * 4);
      }
      else {
        local_7c = *(int *)(in_RDI + (long)local_14 * 4);
      }
      *(int *)(in_RDI + (long)local_14 * 4) = local_7c;
    }
    break;
  case 0x3ea:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (*(long *)(in_RDI + (long)local_14 * 8) < 0) {
        local_f8 = -*(long *)(in_RDI + (long)local_14 * 8);
      }
      else {
        local_f8 = *(long *)(in_RDI + (long)local_14 * 8);
      }
      *(long *)(in_RDI + (long)local_14 * 8) = local_f8;
    }
    break;
  case 0x3eb:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (*(float *)(in_RDI + (long)local_14 * 4) < 0.0) {
        local_ec = *(uint *)(in_RDI + (long)local_14 * 4) ^ 0x80000000;
      }
      else {
        local_ec = *(uint *)(in_RDI + (long)local_14 * 4);
      }
      *(uint *)(in_RDI + (long)local_14 * 4) = local_ec;
    }
    break;
  case 0x3ec:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (*(double *)(in_RDI + (long)local_14 * 8) < 0.0) {
        local_e8 = *(ulong *)(in_RDI + (long)local_14 * 8) ^ 0x8000000000000000;
      }
      else {
        local_e8 = *(ulong *)(in_RDI + (long)local_14 * 8);
      }
      *(ulong *)(in_RDI + (long)local_14 * 8) = local_e8;
    }
    break;
  default:
    pnga_error(in_stack_000000b0,in_stack_000000a8);
    break;
  case 0x3ee:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      uVar1 = *(undefined8 *)(in_RDI + (long)local_14 * 8);
      local_68 = (float)uVar1;
      if (local_68 < 0.0) {
        local_bc = -local_68;
      }
      else {
        local_bc = local_68;
      }
      fStack_64 = (float)((ulong)uVar1 >> 0x20);
      if (fStack_64 < 0.0) {
        local_c4 = -fStack_64;
      }
      else {
        local_c4 = fStack_64;
      }
      if (local_bc < local_c4) {
        if (fStack_64 < 0.0) {
          local_d4 = -fStack_64;
        }
        else {
          local_d4 = fStack_64;
        }
        dVar3 = sqrt((double)((local_68 / fStack_64) * (local_68 / fStack_64) + 1.0));
        *(float *)(in_RDI + (long)local_14 * 8) = (float)((double)local_d4 * dVar3);
      }
      else if ((local_68 != 0.0) || (NAN(local_68))) {
        if (local_68 < 0.0) {
          local_c8 = -local_68;
        }
        else {
          local_c8 = local_68;
        }
        dVar3 = sqrt((double)((fStack_64 / local_68) * (fStack_64 / local_68) + 1.0));
        *(float *)(in_RDI + (long)local_14 * 8) = (float)((double)local_c8 * dVar3);
      }
      else {
        *(undefined4 *)(in_RDI + (long)local_14 * 8) = 0;
      }
      *(undefined4 *)(in_RDI + 4 + (long)local_14 * 8) = 0;
    }
    break;
  case 0x3ef:
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      pdVar2 = (double *)(in_RDI + (long)local_14 * 0x10);
      local_a0 = *pdVar2;
      local_b0 = pdVar2[1];
      local_88 = local_a0;
      if (local_a0 < 0.0) {
        local_88 = -local_a0;
      }
      local_98 = local_b0;
      if (local_b0 < 0.0) {
        local_98 = -local_b0;
      }
      if (local_88 < local_98) {
        local_a0 = local_a0 / local_b0;
        if (local_b0 < 0.0) {
          local_b0 = -local_b0;
        }
        dVar3 = sqrt(local_a0 * local_a0 + 1.0);
        *(double *)(in_RDI + (long)local_14 * 0x10) = local_b0 * dVar3;
      }
      else if ((local_a0 != 0.0) || (NAN(local_a0))) {
        local_b0 = local_b0 / local_a0;
        if (local_a0 < 0.0) {
          local_a0 = -local_a0;
        }
        dVar3 = sqrt(local_b0 * local_b0 + 1.0);
        *(double *)(in_RDI + (long)local_14 * 0x10) = local_a0 * dVar3;
      }
      else {
        *(undefined8 *)(in_RDI + (long)local_14 * 0x10) = 0;
      }
      *(undefined8 *)(in_RDI + (long)local_14 * 0x10 + 8) = 0;
    }
  }
  return;
}

Assistant:

static void do_abs(void *x, int n, int type)
{
#define ARMCI_ABS_INT(a)  (((a) >= 0)   ? (a) : (-(a)))
#define ARMCI_ABS_FLT(a)  (((a) >= 0.0) ? (a) : (-(a)))
#define DO_ABS(ARMCI_TYPE, C_TYPE, WHICH)       \
    if (type == ARMCI_TYPE) {                   \
        int i;                                  \
        C_TYPE *y = (C_TYPE *)x;                \
        for (i = 0; i < n; i++) {               \
            y[i] = ARMCI_ABS_##WHICH(y[i]);     \
        }                                       \
    }                                           \
    else
    DO_ABS(ARMCI_INT,       int,        INT)
    DO_ABS(ARMCI_LONG,      long,       INT)
    DO_ABS(ARMCI_LONG_LONG, long long,  INT)
    DO_ABS(ARMCI_FLOAT,     float,      FLT)
    DO_ABS(ARMCI_DOUBLE,    double,     FLT)
    {
        comex_error("unsupported ABS operation", 1);
    }
#undef ARMCI_ABS_INT
#undef ARMCI_ABS_FLT
#undef DO_ABS
}